

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseSpecialisationParameters(StructuralParser *this)

{
  pool_ptr<soul::AST::ModuleBase> *this_00;
  bool bVar1;
  int iVar2;
  ModuleBase *pMVar3;
  UsingDeclaration *pUVar4;
  Expression *pEVar5;
  ProcessorAliasDeclaration *pPVar6;
  NamespaceAliasDeclaration *pNVar7;
  VariableDeclaration *pVVar8;
  Identifier IVar9;
  Identifier name;
  void *local_70;
  Context context;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  if (bVar1) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
    if (!bVar1) {
      this_00 = &this->module;
      do {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2a9d);
        if (bVar1) {
          pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
          iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[5])(pMVar3);
          if ((char)iVar2 != '\0') {
            Errors::graphCannotHaveSpecialisations<>();
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)&context);
            CompileMessage::~CompileMessage((CompileMessage *)&context);
          }
          getContext(&context,this);
          name = parseIdentifier(this);
          local_70 = (void *)0x0;
          pUVar4 = allocate<soul::AST::UsingDeclaration,soul::AST::Context&,soul::Identifier&,decltype(nullptr)>
                             (this,&context,&name,&local_70);
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
          if (bVar1) {
            pEVar5 = parseType(this,variableType);
            (pUVar4->targetType).object = pEVar5;
          }
          pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
          (*(pMVar3->super_ASTObject)._vptr_ASTObject[0x11])(pMVar3,pUVar4);
LAB_002325d9:
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&context);
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c4fee);
          if (bVar1) {
            pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
            iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[5])(pMVar3);
            if ((char)iVar2 == '\0') {
              Errors::processorSpecialisationNotAllowed<>();
              (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)&context);
              CompileMessage::~CompileMessage((CompileMessage *)&context);
            }
            getContext(&context,this);
            name = parseIdentifier(this);
            pPVar6 = allocate<soul::AST::ProcessorAliasDeclaration,soul::AST::Context&,soul::Identifier>
                               (this,&context,&name);
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
            if (bVar1) {
              pEVar5 = parseType(this,nameOrType);
              (pPVar6->targetProcessor).object = pEVar5;
            }
            pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
            (*(pMVar3->super_ASTObject)._vptr_ASTObject[0x12])(pMVar3,pPVar6);
            goto LAB_002325d9;
          }
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c4a69);
          if (bVar1) {
            pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
            iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[6])(pMVar3);
            if ((char)iVar2 == '\0') {
              Errors::namespaceSpecialisationNotAllowed<>();
              (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)&context);
              CompileMessage::~CompileMessage((CompileMessage *)&context);
            }
            getContext(&context,this);
            name = parseIdentifier(this);
            pNVar7 = allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier>
                               (this,&context,&name);
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
            if (bVar1) {
              pEVar5 = parseType(this,nameOrType);
              (pNVar7->targetNamespace).object = pEVar5;
            }
            pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
            (*(pMVar3->super_ASTObject)._vptr_ASTObject[0x13])(pMVar3,pNVar7);
            goto LAB_002325d9;
          }
          giveErrorOnExternalKeyword(this);
          pEVar5 = parseType(this,processorParameter);
          getContext(&context,this);
          name.name = (string *)0x0;
          local_70 = (void *)CONCAT71(local_70._1_7_,1);
          pVVar8 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                             (this,&context,pEVar5,&name.name,(bool *)&local_70);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&context);
          pVVar8->isSpecialisation = true;
          IVar9 = parseIdentifier(this);
          (pVVar8->name).name = IVar9.name;
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
          if (bVar1) {
            pEVar5 = parseExpression(this,false);
            (pVVar8->initialValue).object = pEVar5;
          }
          pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(this_00);
          (*(pMVar3->super_ASTObject)._vptr_ASTObject[0x10])(pMVar3,pVVar8);
        }
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
      } while (bVar1);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
    }
  }
  return;
}

Assistant:

void parseSpecialisationParameters()
    {
        if (matchIf (Operator::openParen))
        {
            if (matchIf (Operator::closeParen))
                return;

            do
            {
                if (matchIf (Keyword::using_))
                {
                    if (module->isGraph())
                        throwError (Errors::graphCannotHaveSpecialisations());

                    auto context = getContext();
                    auto name = parseIdentifier();

                    auto& usingDeclaration = allocate<AST::UsingDeclaration> (context, name, nullptr);

                    if (matchIf (Operator::assign))
                        usingDeclaration.targetType = parseType (ParseTypeContext::variableType);

                    module->addSpecialisationParameter (usingDeclaration);
                }
                else if (matchIf (Keyword::processor))
                {
                    if (! module->isGraph())
                        throwError (Errors::processorSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& processorAliasDeclaration = allocate<AST::ProcessorAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        processorAliasDeclaration.targetProcessor = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (processorAliasDeclaration);
                }
                else if (matchIf (Keyword::namespace_))
                {
                    if (! module->isNamespace())
                        throwError (Errors::namespaceSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& namespaceAliasDeclaration = allocate<AST::NamespaceAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        namespaceAliasDeclaration.targetNamespace = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (namespaceAliasDeclaration);
                }
                else
                {
                    giveErrorOnExternalKeyword();
                    auto& parameterType = parseType (ParseTypeContext::processorParameter);
                    auto& parameterVariable = allocate<AST::VariableDeclaration> (getContext(), parameterType, nullptr, true);
                    parameterVariable.isSpecialisation = true;
                    parameterVariable.name = parseIdentifier();

                    if (matchIf (Operator::assign))
                        parameterVariable.initialValue = parseExpression();

                    module->addSpecialisationParameter (parameterVariable);
                }
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeParen);
        }
    }